

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void mysprint<char,std::char_traits<char>>
               (basic_ostream<char,_std::char_traits<char>_> *os,aiString *vec)

{
  ostream *poVar1;
  void *this;
  aiString *vec_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  poVar1 = std::operator<<(os,"[length: \'");
  this = (void *)std::ostream::operator<<(poVar1,std::dec);
  poVar1 = (ostream *)std::ostream::operator<<(this,vec->length);
  poVar1 = std::operator<<(poVar1,"\' content: \'");
  poVar1 = std::operator<<(poVar1,vec->data);
  std::operator<<(poVar1,"\']");
  return;
}

Assistant:

void mysprint(std::basic_ostream<char_t, traits_t>& os,  const aiString& vec)   {
    os << "[length: \'" << std::dec << vec.length << "\' content: \'"  << vec.data << "\']";
}